

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Merge(MergeForm4 Merge)

{
  value_type vVar1;
  value_type vVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  byte bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  anon_class_8_1_a81546ea in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  uint8_t in_stack_fffffffffffffd86;
  uint8_t in_stack_fffffffffffffd87;
  uint32_t in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  Image *in_stack_fffffffffffffd90;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *pvVar9;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint32_t *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd0;
  size_type sVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffde0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  undefined1 isAnyValue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  value_type vVar11;
  value_type vVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  pair<unsigned_int,_unsigned_int> local_124;
  pair<unsigned_int,_unsigned_int> local_11c;
  pair<unsigned_int,_unsigned_int> local_114;
  pair<unsigned_int,_unsigned_int> local_10c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_100 [2];
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_c0;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_98;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_80;
  uchar *local_78;
  uchar *local_70;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_68 [2];
  code *local_38;
  
  local_38 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffd78.input >> 0x20));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1dc3a8);
  local_70 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffd78.input);
  local_78 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffd78.input);
  __first._M_current._4_4_ = in_stack_fffffffffffffd8c;
  __first._M_current._0_4_ = in_stack_fffffffffffffd88;
  __last._M_current._4_2_ = in_stack_fffffffffffffd84;
  __last._M_current._0_4_ = in_stack_fffffffffffffd80;
  __last._M_current._6_1_ = in_stack_fffffffffffffd86;
  __last._M_current._7_1_ = in_stack_fffffffffffffd87;
  local_80 = local_68;
  local_98 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form4_Merge(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                          (__first,__last,in_stack_fffffffffffffd78);
  Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,
             in_stack_fffffffffffffd87,in_stack_fffffffffffffd86);
  Test_Helper::uniformRGBImage
            ((uint8_t)((uint)in_stack_fffffffffffffd9c >> 0x18),in_stack_fffffffffffffd90);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dc474);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1dc489);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
           (allocator_type *)in_stack_fffffffffffffd90);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1dc4b2);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_68,0);
  local_10c = Unit_Test::imageSize((Image *)in_stack_fffffffffffffd78.input);
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_100,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_10c);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_68,1);
  local_114 = Unit_Test::imageSize((Image *)in_stack_fffffffffffffd78.input);
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_100,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_114);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](local_68,2);
  local_11c = Unit_Test::imageSize((Image *)in_stack_fffffffffffffd78.input);
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_100,2);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_11c);
  local_124 = Unit_Test::imageSize((Image *)in_stack_fffffffffffffd78.input);
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_100,3);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_124);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dc618);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dc62d);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (uint32_t *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  sVar10 = 0;
  pvVar9 = local_68;
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](pvVar9,0);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,sVar10);
  vVar11 = *pvVar6;
  this = &local_158;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,sVar10);
  vVar12 = *pvVar6;
  sVar10 = 1;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](pvVar9,1);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,sVar10);
  vVar1 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,sVar10);
  vVar2 = *pvVar6;
  pvVar8 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](pvVar9,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,2);
  value = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,(size_type)value);
  isAnyValue = (undefined1)((ulong)this >> 0x38);
  pvVar9 = &local_c0;
  (*local_38)(pvVar5,vVar11,vVar12,pvVar7,vVar1,vVar2);
  sVar10 = 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_140,3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_158,sVar10);
  bVar3 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(vVar12,vVar11),(uint32_t)((ulong)pvVar5 >> 0x20),
                     (uint32_t)pvVar5,(uint32_t)((ulong)pvVar8 >> 0x20),(uint32_t)pvVar8,value,
                     (bool)isAnyValue);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar9);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)pvVar9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dc8b7);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(pvVar9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar9);
  return (bool)(bVar3 & 1);
}

Assistant:

bool form4_Merge(MergeForm4 Merge)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > input;
        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        PenguinV_Image::Image output = uniformRGBImage( intensityValue() );

        std::vector < std::pair <uint32_t, uint32_t> > size( 4 );
        size[0] = imageSize( input[0] );
        size[1] = imageSize( input[1] );
        size[2] = imageSize( input[2] );
        size[3] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        Merge( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], input[2], roiX[2], roiY[2], output, roiX[3], roiY[3], roiWidth, roiHeight );

        return verifyImage( output, roiX[3], roiY[3], roiWidth, roiHeight, intensity, false );
    }